

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_3ee9::test_add_checked(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *r;
  
  r = roaring64_bitmap_create();
  _Var1 = roaring64_bitmap_add_checked(r,0);
  _assert_true((ulong)_Var1,"roaring64_bitmap_add_checked(r, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x106);
  _Var1 = roaring64_bitmap_add_checked(r,0);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_add_checked(r, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x107);
  _Var1 = roaring64_bitmap_add_checked(r,10000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_add_checked(r, 10000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x108);
  _Var1 = roaring64_bitmap_add_checked(r,10000);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_add_checked(r, 10000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x109);
  _Var1 = roaring64_bitmap_add_checked(r,200000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_add_checked(r, 200000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x10a);
  _Var1 = roaring64_bitmap_add_checked(r,200000);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_add_checked(r, 200000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x10b);
  assert_r64_valid((roaring64_bitmap_t *)r);
  _Var1 = roaring64_bitmap_contains(r,0);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x10e);
  _Var1 = roaring64_bitmap_contains(r,10000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 10000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x10f);
  _Var1 = roaring64_bitmap_contains(r,200000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 200000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x110);
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_add_checked) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();

    assert_true(roaring64_bitmap_add_checked(r, 0));
    assert_false(roaring64_bitmap_add_checked(r, 0));
    assert_true(roaring64_bitmap_add_checked(r, 10000));
    assert_false(roaring64_bitmap_add_checked(r, 10000));
    assert_true(roaring64_bitmap_add_checked(r, 200000));
    assert_false(roaring64_bitmap_add_checked(r, 200000));

    assert_r64_valid(r);
    assert_true(roaring64_bitmap_contains(r, 0));
    assert_true(roaring64_bitmap_contains(r, 10000));
    assert_true(roaring64_bitmap_contains(r, 200000));

    roaring64_bitmap_free(r);
}